

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Teleport
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  undefined8 *puVar2;
  byte bVar3;
  PClass *pPVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  PClass *pPVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  AActor *this;
  DSpotState *this_00;
  PClassActor *pPVar12;
  ASpecialSpot *pAVar13;
  double *pdVar14;
  AActor *pAVar15;
  AActor *origin;
  ulong uVar16;
  char *pcVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double local_c0;
  PClassActor *local_b8;
  FState *local_a8;
  double local_a0;
  FName local_8c;
  DVector3 local_88;
  DVector3 local_68;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
LAB_003dc0ba:
    pcVar17 = "(paramnum) < numparam";
LAB_003dc0f5:
    __assert_fail(pcVar17,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1378,
                  "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dc0b1:
    pcVar17 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003dc0f5;
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003db98a;
    pPVar11 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar11 == (PClass *)0x0) {
      iVar6 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar11 = (PClass *)CONCAT44(extraout_var,iVar6);
      (origin->super_DThinker).super_DObject.Class = pPVar11;
    }
    bVar18 = pPVar11 != (PClass *)0x0;
    if (pPVar11 != pPVar4 && bVar18) {
      do {
        pPVar11 = pPVar11->ParentClass;
        bVar18 = pPVar11 != (PClass *)0x0;
        if (pPVar11 == pPVar4) break;
      } while (pPVar11 != (PClass *)0x0);
    }
    if (!bVar18) {
      pcVar17 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dc0f5;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003dc0b1;
LAB_003db98a:
    origin = (AActor *)0x0;
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_003dc0ba;
  if (param[1].field_0.field_3.Type != '\x03') goto LAB_003dc0b1;
  puVar2 = (undefined8 *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (puVar2 != (undefined8 *)0x0) {
      pPVar11 = (PClass *)puVar2[1];
      if (pPVar11 == (PClass *)0x0) {
        pPVar11 = (PClass *)(**(code **)*puVar2)(puVar2);
        puVar2[1] = pPVar11;
      }
      bVar18 = pPVar11 != (PClass *)0x0;
      if (pPVar11 != pPVar4 && bVar18) {
        do {
          pPVar11 = pPVar11->ParentClass;
          bVar18 = pPVar11 != (PClass *)0x0;
          if (pPVar11 == pPVar4) break;
        } while (pPVar11 != (PClass *)0x0);
      }
      if (!bVar18) {
        pcVar17 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003dc0f5;
      }
    }
  }
  else if (puVar2 != (undefined8 *)0x0) goto LAB_003dc0b1;
  if (numparam < 3) goto LAB_003dc0ba;
  if (param[2].field_0.field_3.Type != '\x03') {
    pcVar17 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_003dc0f5;
  }
  if (numparam == 3) {
    if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dc1b8:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1379,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar6 = defaultparam->Array[3].field_0.i;
    pPVar12 = (PClassActor *)(origin->super_DThinker).super_DObject.Class;
    if (pPVar12 == (PClassActor *)0x0) {
      iVar7 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar12 = (PClassActor *)CONCAT44(extraout_var_00,iVar7);
      (origin->super_DThinker).super_DObject.Class = (PClass *)pPVar12;
    }
    local_a8 = FStateLabelStorage::GetState(&StateLabels,iVar6,pPVar12,false);
LAB_003dbb11:
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\x03') {
LAB_003dc0e2:
      pcVar17 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003dc1d7:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137a,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pPVar12 = (PClassActor *)param[4].field_0.field_1.a;
    if (param[4].field_0.field_1.atag != 1) {
      if (pPVar12 != (PClassActor *)0x0) goto LAB_003dc0e2;
      pPVar12 = (PClassActor *)0x0;
    }
LAB_003dbb37:
    if (param[5].field_0.field_3.Type != '\x03') {
LAB_003dc0c3:
      pcVar17 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003dc0ca:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137b,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_b8 = (PClassActor *)param[5].field_0.field_1.a;
    if (param[5].field_0.field_1.atag != 1) {
      if (local_b8 != (PClassActor *)0x0) goto LAB_003dc0c3;
      local_b8 = (PClassActor *)0x0;
    }
LAB_003dbb58:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dc171:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137c,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar8 = param[6].field_0.i;
LAB_003dbb67:
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc152:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137d,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar19 = (undefined4)*(undefined8 *)&param[7].field_0;
    uVar20 = (undefined4)((ulong)*(undefined8 *)&param[7].field_0 >> 0x20);
LAB_003dbb78:
    if (param[8].field_0.field_3.Type != '\x01') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc133:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137e,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_a0 = param[8].field_0.f;
LAB_003dbb95:
    local_c0 = (double)CONCAT44(uVar20,uVar19);
    if (param[9].field_0.field_3.Type != '\0') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dc114:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137f,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar17 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dc1b8;
    }
    iVar6 = param[3].field_0.i;
    pPVar12 = (PClassActor *)(origin->super_DThinker).super_DObject.Class;
    if (pPVar12 == (PClassActor *)0x0) {
      iVar7 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar12 = (PClassActor *)CONCAT44(extraout_var_01,iVar7);
      (origin->super_DThinker).super_DObject.Class = (PClass *)pPVar12;
    }
    local_a8 = FStateLabelStorage::GetState(&StateLabels,iVar6,pPVar12,false);
    if ((uint)numparam < 5) goto LAB_003dbb11;
    if ((param[4].field_0.field_3.Type != '\x03') ||
       (pPVar12 = (PClassActor *)param[4].field_0.field_1.a,
       pPVar12 != (PClassActor *)0x0 && param[4].field_0.field_1.atag != 1)) {
      pcVar17 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003dc1d7;
    }
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003dbb37;
    }
    if ((param[5].field_0.field_3.Type != '\x03') ||
       (local_b8 = (PClassActor *)param[5].field_0.field_1.a,
       local_b8 != (PClassActor *)0x0 && param[5].field_0.field_1.atag != 1)) {
      pcVar17 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003dc0ca;
    }
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003dbb58;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar17 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dc171;
    }
    uVar8 = param[6].field_0.i;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003dbb67;
    }
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dc152;
    }
    local_c0 = *(double *)&param[7].field_0;
    uVar19 = SUB84(local_c0,0);
    uVar20 = (undefined4)((ulong)local_c0 >> 0x20);
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003dbb78;
    }
    if (param[8].field_0.field_3.Type != '\x01') {
      pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dc133;
    }
    local_a0 = param[8].field_0.f;
    if (numparam == 9) {
      param = defaultparam->Array;
      goto LAB_003dbb95;
    }
    if (param[9].field_0.field_3.Type != '\0') {
      pcVar17 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dc114;
    }
  }
  this = COPY_AAPTR(origin,param[9].field_0.i);
  if (numret < 2) {
    iVar6 = 1;
    if (numret == 1) goto LAB_003dbbef;
    bVar18 = false;
  }
  else {
    if (ret[1].RegType != '\0') goto LAB_003dc189;
    *(undefined4 *)ret[1].Location = 0;
    iVar6 = 2;
LAB_003dbbef:
    numret = iVar6;
    VMReturn::SetPointer(ret,(void *)0x0,0);
    bVar18 = true;
  }
  if (this == (AActor *)0x0) {
    return numret;
  }
  if ((((this->flags2).Value & 0x80) != 0) && ((uVar8 & 0x400) == 0)) {
    return numret;
  }
  if ((uVar8 & 2) != 0) {
    iVar6 = this->health;
    iVar9 = AActor::SpawnHealth(this);
    iVar7 = 1;
    if (0xe < iVar9 + 7U) {
      iVar9 = AActor::SpawnHealth(this);
      iVar7 = iVar9 + 7;
      if (-1 < iVar9) {
        iVar7 = iVar9;
      }
      iVar7 = iVar7 >> 3;
    }
    uVar10 = iVar6 / iVar7;
    uVar16 = 8;
    if (uVar10 < 8) {
      uVar16 = (ulong)uVar10;
    }
    uVar10 = FRandom::GenRand32(&pr_teleport);
    if (AF_AActor_A_Teleport::chance[uVar16] <= (int)(uVar10 & 0xff)) {
      return numret;
    }
  }
  this_00 = DSpotState::GetSpotState(true);
  if (this_00 == (DSpotState *)0x0) {
    return numret;
  }
  if (pPVar12 == (PClassActor *)0x0) {
    pPVar12 = PClass::FindActor("BossSpot");
  }
  pAVar13 = DSpotState::GetSpotWithMinMaxDistance
                      (this_00,pPVar12,(this->__Pos).X,(this->__Pos).Y,local_c0,local_a0);
  if (pAVar13 == (ASpecialSpot *)0x0) {
    return numret;
  }
  if ((uVar8 >> 0xb & 1) == 0) {
    dVar21 = (pAVar13->super_AActor).floorz;
    uVar19 = SUB84(dVar21,0);
    uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
    dVar21 = (pAVar13->super_AActor).ceilingz;
  }
  else {
    pdVar14 = &(pAVar13->super_AActor).__Pos.Z;
    if ((uVar8 & 0x20) == 0) {
      pdVar14 = &(pAVar13->super_AActor).floorz;
    }
    dVar21 = (pAVar13->super_AActor).ceilingz;
    if (dVar21 < this->Height + *pdVar14) {
      return numret;
    }
    dVar1 = (pAVar13->super_AActor).floorz;
    uVar19 = SUB84(dVar1,0);
    uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
    if (*pdVar14 < dVar1) {
      return numret;
    }
  }
  local_88.Z = (double)CONCAT44(uVar20,uVar19);
  local_68.X = (this->__Pos).X;
  local_68.Y = (this->__Pos).Y;
  local_68.Z = (this->__Pos).Z;
  dVar1 = (pAVar13->super_AActor).__Pos.Z;
  if ((pAVar13->super_AActor).Height + dVar1 <= dVar21) {
    if ((double)CONCAT44(uVar20,uVar19) < dVar1 || (double)CONCAT44(uVar20,uVar19) == dVar1) {
      local_88.Z = (double)CONCAT44(uVar20,uVar19) + (dVar1 - (double)CONCAT44(uVar20,uVar19));
    }
  }
  else {
    local_88.Z = dVar21 - this->Height;
  }
  local_88.X = (pAVar13->super_AActor).__Pos.X;
  local_88.Y = (pAVar13->super_AActor).__Pos.Y;
  bVar3 = (byte)uVar8;
  bVar5 = P_TeleportMove(this,&local_88,(bool)(bVar3 & 1),true);
  if ((bVar5) || ((uVar8 & 4) == 0)) {
    uVar19 = 0;
    if (bVar5) goto LAB_003dbec4;
  }
  else {
    AActor::SetOrigin(this,local_88.X,local_88.Y,local_88.Z,false);
LAB_003dbec4:
    if ((local_b8 != (PClassActor *)0x0) || ((uVar8 & 0x100) != 0)) {
      if ((uVar8 & 0x40) == 0) {
        if ((uVar8 >> 8 & 1) == 0) {
          pAVar15 = AActor::StaticSpawn(local_b8,&local_68,ALLOW_REPLACE,false);
          if (pAVar15 != (AActor *)0x0) {
            (pAVar15->target).field_0.p = this;
          }
          goto LAB_003dbf18;
        }
        P_SpawnTeleportFog(this,&local_68,true,true);
        if ((char)bVar3 < '\0') goto LAB_003dbfe2;
LAB_003dbfb5:
        local_48.X = (this->__Pos).X;
        local_48.Y = (this->__Pos).Y;
        local_48.Z = (this->__Pos).Z;
        P_SpawnTeleportFog(this,&local_48,false,true);
      }
      else {
LAB_003dbf18:
        if (-1 < (char)bVar3) {
          if ((uVar8 >> 8 & 1) != 0) goto LAB_003dbfb5;
          local_48.X = (this->__Pos).X;
          local_48.Y = (this->__Pos).Y;
          local_48.Z = (this->__Pos).Z;
          pAVar15 = AActor::StaticSpawn(local_b8,&local_48,ALLOW_REPLACE,false);
          if (pAVar15 != (AActor *)0x0) {
            (pAVar15->target).field_0.p = this;
          }
        }
      }
    }
LAB_003dbfe2:
    pdVar14 = &(pAVar13->super_AActor).__Pos.Z;
    if ((uVar8 & 0x20) == 0) {
      pdVar14 = &this->floorz;
    }
    (this->__Pos).Z = *pdVar14;
    if ((uVar8 & 0x10) == 0) {
      (this->Angles).Yaw.Degrees = (pAVar13->super_AActor).Angles.Yaw.Degrees;
    }
    if ((uVar8 & 8) == 0) {
      (this->Vel).X = 0.0;
      (this->Vel).Y = 0.0;
      (this->Vel).Z = 0.0;
    }
    uVar19 = 1;
    if ((uVar8 >> 9 & 1) == 0) {
      if (local_a8 == (FState *)0x0) {
        local_8c.Index = FName::NameManager::FindName(&FName::NameData,"Teleport",false);
        local_a8 = AActor::FindState(origin,&local_8c);
        if (local_a8 == (FState *)0x0) {
          return numret;
        }
      }
      if (!bVar18) {
        return numret;
      }
      VMReturn::SetPointer(ret,local_a8,0);
      return numret;
    }
  }
  if (1 < numret) {
    if (ret[1].RegType != '\0') {
LAB_003dc189:
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(undefined4 *)ret[1].Location = uVar19;
  }
  return numret;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Teleport)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_STATE_DEF		(teleport_state)			
	PARAM_CLASS_DEF		(target_type, ASpecialSpot)	
	PARAM_CLASS_DEF		(fog_type, AActor)			
	PARAM_INT_DEF		(flags)						
	PARAM_FLOAT_DEF		(mindist)					
	PARAM_FLOAT_DEF		(maxdist)					
	PARAM_INT_DEF		(ptr)						

	AActor *ref = COPY_AAPTR(self, ptr);

	// A_Teleport and A_Warp were the only codepointers that can state jump
	// *AND* have a meaningful inventory state chain result. Grrr.
	if (numret > 1)
	{
		ret[1].SetInt(false);
		numret = 2;
	}
	if (numret > 0)
	{
		ret[0].SetPointer(NULL, ATAG_STATE);
	}

	if (!ref)
	{
		return numret;
	}

	if ((ref->flags2 & MF2_NOTELEPORT) && !(flags & TF_OVERRIDE))
	{
		return numret;
	}

	// Randomly choose not to teleport like A_Srcr2Decide.
	if (flags & TF_RANDOMDECIDE)
	{
		static const int chance[] =
		{
			192, 120, 120, 120, 64, 64, 32, 16, 0
		};

		unsigned int chanceindex = ref->health / ((ref->SpawnHealth()/8 == 0) ? 1 : ref->SpawnHealth()/8);

		if (chanceindex >= countof(chance))
		{
			chanceindex = countof(chance) - 1;
		}

		if (pr_teleport() >= chance[chanceindex])
		{
			return numret;
		}
	}

	DSpotState *state = DSpotState::GetSpotState();
	if (state == NULL)
	{
		return numret;
	}

	if (target_type == NULL)
	{
		target_type = PClass::FindActor("BossSpot");
	}

	AActor *spot = state->GetSpotWithMinMaxDistance(target_type, ref->X(), ref->Y(), mindist, maxdist);
	if (spot == NULL)
	{
		return numret;
	}

	// [MC] By default, the function adjusts the actor's Z if it's below the floor or above the ceiling.
	// This can be an issue as actors designed to maintain specific z positions wind up teleporting
	// anyway when they should not, such as a floor rising above or ceiling lowering below the position
	// of the spot.
	if (flags & TF_SENSITIVEZ)
	{
		double posz = (flags & TF_USESPOTZ) ? spot->Z() : spot->floorz;
		if ((posz + ref->Height > spot->ceilingz) || (posz < spot->floorz))
		{
			return numret;
		}
	}
	DVector3 prev = ref->Pos();
	double aboveFloor = spot->Z() - spot->floorz;
	double finalz = spot->floorz + aboveFloor;

	if (spot->Top() > spot->ceilingz)
		finalz = spot->ceilingz - ref->Height;
	else if (spot->Z() < spot->floorz)
		finalz = spot->floorz;

	DVector3 tpos = spot->PosAtZ(finalz);

	//Take precedence and cooperate with telefragging first.
	bool tele_result = P_TeleportMove(ref, tpos, !!(flags & TF_TELEFRAG));

	if (!tele_result && (flags & TF_FORCED))
	{
		//If for some reason the original move didn't work, regardless of telefrag, force it to move.
		ref->SetOrigin(tpos, false);
		tele_result = true;
	}

	AActor *fog1 = NULL, *fog2 = NULL;
	if (tele_result)
	{
		//If a fog type is defined in the parameter, or the user wants to use the actor's predefined fogs,
		//and if there's no desire to be fogless, spawn a fog based upon settings.
		if (fog_type || (flags & TF_USEACTORFOG))
		{ 
			if (!(flags & TF_NOSRCFOG))
			{
				if (flags & TF_USEACTORFOG)
					P_SpawnTeleportFog(ref, prev, true, true);
				else
				{
					fog1 = Spawn(fog_type, prev, ALLOW_REPLACE);
					if (fog1 != NULL)
						fog1->target = ref;
				}
			}
			if (!(flags & TF_NODESTFOG))
			{
				if (flags & TF_USEACTORFOG)
					P_SpawnTeleportFog(ref, ref->Pos(), false, true);
				else
				{
					fog2 = Spawn(fog_type, ref->Pos(), ALLOW_REPLACE);
					if (fog2 != NULL)
						fog2->target = ref;
				}
			}
		}
		
		ref->SetZ((flags & TF_USESPOTZ) ? spot->Z() : ref->floorz, false);

		if (!(flags & TF_KEEPANGLE))
			ref->Angles.Yaw = spot->Angles.Yaw;

		if (!(flags & TF_KEEPVELOCITY)) ref->Vel.Zero();

		if (!(flags & TF_NOJUMP)) //The state jump should only happen with the calling actor.
		{
			if (teleport_state == NULL)
			{
				// Default to Teleport.
				teleport_state = self->FindState("Teleport");
				// If still nothing, then return.
				if (teleport_state == NULL)
				{
					return numret;
				}
			}
			if (numret > 0)
			{
				ret[0].SetPointer(teleport_state, ATAG_STATE);
			}
			return numret;
		}
	}
	if (numret > 1)
	{
		ret[1].SetInt(tele_result);
	}
	return numret;
}